

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::PairMatcherImpl<std::pair<unsigned_long_const,unsigned_long>const&>::
PairMatcherImpl<int,int>
          (PairMatcherImpl<std::pair<unsigned_long_const,unsigned_long>const&> *this,
          int first_matcher,int second_matcher)

{
  unsigned_long local_28;
  
  *(undefined ***)this = &PTR__PairMatcherImpl_00344348;
  local_28 = (unsigned_long)first_matcher;
  Matcher<const_unsigned_long_&>::Matcher((Matcher<const_unsigned_long_&> *)(this + 8),&local_28);
  local_28 = (unsigned_long)second_matcher;
  Matcher<const_unsigned_long_&>::Matcher((Matcher<const_unsigned_long_&> *)(this + 0x20),&local_28)
  ;
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}